

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O1

bool __thiscall
msgpack11::Value<(msgpack11::MsgPack::Type)8,_unsigned_short>::less
          (Value<(msgpack11::MsgPack::Type)8,_unsigned_short> *this,MsgPackValue *other)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  iVar1 = (*other->_vptr_MsgPackValue[3])(other);
  iVar2 = (*other->_vptr_MsgPackValue[3])(other);
  bVar3 = true;
  if (iVar2 < 9) {
    if (iVar1 == 8) {
      bVar3 = this->m_value < *(ushort *)&other[1]._vptr_MsgPackValue;
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool less(const MsgPackValue * other) const override {
        bool const is_same_type = tag == other->type();
        bool const is_less_type = tag < other->type();
        return is_less_type || (is_same_type && (m_value < static_cast<const Value<tag, T> *>(other)->m_value));
    }